

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O2

void iterator_suite::test_push_alternating(void)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  iterator iVar1;
  iterator iVar2;
  allocator_type local_e1;
  vector<int,_std::allocator<int>_> expect;
  int local_c8 [4];
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  
  span.member.data = array._M_elems;
  array._M_elems[0] = 0;
  array._M_elems[1] = 0;
  array._M_elems[2] = 0;
  array._M_elems[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0xb);
  local_c8[0] = 0xb;
  __l._M_len = 1;
  __l._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_e1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x2fe,"void iterator_suite::test_push_alternating()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  vista::circular_view<int,_18446744073709551615UL>::push_front(&span,0x16);
  local_c8[0] = 0x16;
  local_c8[1] = 0xb;
  __l_00._M_len = 2;
  __l_00._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_00,&local_e1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x304,"void iterator_suite::test_push_alternating()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x21);
  local_c8[0] = 0x16;
  local_c8[1] = 0xb;
  local_c8[2] = 0x21;
  __l_01._M_len = 3;
  __l_01._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_01,&local_e1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x30a,"void iterator_suite::test_push_alternating()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  vista::circular_view<int,_18446744073709551615UL>::push_front(&span,0x2c);
  local_c8[0] = 0x2c;
  local_c8[1] = 0x16;
  local_c8[2] = 0xb;
  local_c8[3] = 0x21;
  __l_02._M_len = 4;
  __l_02._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_02,&local_e1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x310,"void iterator_suite::test_push_alternating()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x37);
  local_c8[0] = 0x16;
  local_c8[1] = 0xb;
  local_c8[2] = 0x21;
  local_c8[3] = 0x37;
  __l_03._M_len = 4;
  __l_03._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_03,&local_e1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x316,"void iterator_suite::test_push_alternating()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  vista::circular_view<int,_18446744073709551615UL>::push_front(&span,0x42);
  local_c8[0] = 0x42;
  local_c8[1] = 0x16;
  local_c8[2] = 0xb;
  local_c8[3] = 0x21;
  __l_04._M_len = 4;
  __l_04._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_04,&local_e1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x31c,"void iterator_suite::test_push_alternating()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void test_push_alternating()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span.push_back(11);
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_front(22);
    {
        std::vector<int> expect = { 22, 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(33);
    {
        std::vector<int> expect = { 22, 11, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_front(44);
    {
        std::vector<int> expect = { 44, 22, 11, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(55);
    {
        std::vector<int> expect = { 22, 11, 33, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_front(66);
    {
        std::vector<int> expect = { 66, 22, 11, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}